

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_urlencode.cpp
# Opt level: O1

string * char2hex_abi_cxx11_(string *__return_storage_ptr__,char dec)

{
  char dig2;
  char dig1;
  byte local_1a;
  byte local_19;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_19 = (byte)dec >> 4;
  local_1a = dec & 0xf;
  if ((byte)dec < 0xa0) {
    local_19 = local_19 | 0x30;
  }
  if ((byte)(local_19 - 10) < 6) {
    local_19 = local_19 + 0x37;
  }
  if (local_1a < 10) {
    local_1a = local_1a | 0x30;
  }
  if ((byte)(local_1a - 10) < 6) {
    local_1a = local_1a + 0x37;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_19);
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_1a);
  return __return_storage_ptr__;
}

Assistant:

std::string char2hex(char dec)
{
	std::string r;
	char dig1 = (dec&0xF0)>>4;
	char dig2 = (dec&0x0F);
	if ( 0<= dig1 && dig1<= 9) dig1+=48;    //0,48 in ascii
	if (10<= dig1 && dig1<=15) dig1+=65-10; //A,65 in ascii
	if ( 0<= dig2 && dig2<= 9) dig2+=48;
	if (10<= dig2 && dig2<=15) dig2+=65-10;

	r.append( &dig1, 1);
	r.append( &dig2, 1);
	return r;
}